

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O2

void __thiscall nvim::NvimRPC::async_call<long,long>(NvimRPC *this,string *method,long *u,long *u_1)

{
  unsigned_long d;
  packer<msgpack::v1::sbuffer> *this_00;
  long *__n;
  Packer pk;
  sbuffer sbuf;
  
  __n = u_1;
  msgpack::v1::sbuffer::sbuffer(&sbuf,0x2000);
  pk.m_stream = &sbuf;
  this_00 = msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&pk,4);
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_imp_uint64<unsigned_long>(this_00,0);
  d = this->msgid_;
  this->msgid_ = d + 1;
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_imp_uint64<unsigned_long>(this_00,d);
  msgpack::v1::operator<<(this_00,method);
  msgpack::v1::packer<msgpack::v1::sbuffer>::pack_array(&pk,2);
  nvim::detail::pack<long,long>(&pk,u,u_1);
  Socket::write(&this->socket_,(int)sbuf.m_data,(void *)sbuf.m_size,(size_t)__n);
  free(sbuf.m_data);
  return;
}

Assistant:

void NvimRPC::async_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    socket_.write(sbuf.data(), sbuf.size(), 5);
}